

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int stdin2mem(int hd)

{
  size_t __n;
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__ptr;
  int iVar4;
  ulong __size;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  __ptr = *memTable[hd].memaddrptr;
  __size = *memTable[hd].memsizeptr;
  __n = memTable[hd].deltasize;
  iVar2 = fgetc(_stdin);
  if (iVar2 != -1) {
    iVar4 = 0;
    uVar5 = 0;
    do {
      iVar1 = 0;
      if ((iVar2 == "first keyword not SIMPLE"[(long)iVar4 + 0x12]) &&
         (iVar1 = iVar4 + 1, iVar4 + 1 == 6)) {
        builtin_strncpy(__ptr,"SIMPLE",6);
        sVar3 = fread(__ptr + 6,1,__size - 6,_stdin);
        uVar6 = sVar3 + 6;
        if (uVar6 < __size) {
          memTable[hd].fitsfilesize = uVar6;
        }
        else {
          do {
            __size = __size + __n;
            __ptr = (char *)realloc(__ptr,__size);
            if (__ptr == (char *)0x0) {
              ffpmsg("realloc failed while copying stdin (stdin2mem)");
              return 0x71;
            }
            sVar3 = fread(__ptr + uVar6,1,__n,_stdin);
            uVar6 = uVar6 + sVar3;
          } while (__n <= sVar3);
          memTable[hd].fitsfilesize = uVar6;
          *memTable[hd].memaddrptr = __ptr;
          *memTable[hd].memsizeptr = __size;
        }
        return 0;
      }
      iVar4 = iVar1;
      iVar2 = fgetc(_stdin);
    } while ((iVar2 != -1) && (bVar7 = uVar5 < 1999, uVar5 = uVar5 + 1, bVar7));
  }
  ffpmsg("Couldn\'t find the string \'SIMPLE\' in the stdin stream.");
  ffpmsg("This does not look like a FITS file.");
  return 0x68;
}

Assistant:

int stdin2mem(int hd)  /* handle number */
/*
  Copy the stdin stream into memory.  Fill whatever amount of memory
  has already been allocated, then realloc more memory if necessary.
*/
{
    size_t nread, memsize, delta;
    LONGLONG filesize;
    char *memptr;
    char simple[] = "SIMPLE";
    int c, ii, jj;

    memptr = *memTable[hd].memaddrptr;
    memsize = *memTable[hd].memsizeptr;
    delta = memTable[hd].deltasize;

    filesize = 0;
    ii = 0;

    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(memptr, simple, 6);  /* copy "SIMPLE" to buffer */
              filesize = 6;
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (filesize == 0)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream.");
       ffpmsg("This does not look like a FITS file.");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the initial memory allocation */
    nread = fread(memptr + 6, 1, memsize - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    if (nread < memsize)    /* reached the end? */
    {
       memTable[hd].fitsfilesize = nread;
       return(0);
    }

    filesize = nread;

    while (1)
    {
        /* allocate memory for another FITS block */
        memptr = realloc(memptr, memsize + delta);

        if (!memptr)
        {
            ffpmsg("realloc failed while copying stdin (stdin2mem)");
            return(MEMORY_ALLOCATION);
        }
        memsize += delta;

        /* read another FITS block */
        nread = fread(memptr + filesize, 1, delta, stdin);

        filesize += nread;

        if (nread < delta)    /* reached the end? */
           break;
    }

     memTable[hd].fitsfilesize = filesize;
    *memTable[hd].memaddrptr = memptr;
    *memTable[hd].memsizeptr = memsize;

    return(0);
}